

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenFcs
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcFcsType fcsType,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (fcsType == HDLC_CRC32) {
    Crc32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,stream);
  }
  else if (fcsType == HDLC_CRC16) {
    Crc16((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,stream);
  }
  else {
    if (fcsType != HDLC_CRC8) {
      return __return_storage_ptr__;
    }
    Crc8((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,stream);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__,&_Stack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenFcs( HdlcFcsType fcsType, const vector<U8>& stream ) const
{
    vector<U8> crcRet;
    switch( fcsType )
    {
    case HDLC_CRC8:
        crcRet = Crc8( stream );
        break;
    case HDLC_CRC16:
        crcRet = Crc16( stream );
        break;
    case HDLC_CRC32:
        crcRet = Crc32( stream );
        break;
    }
    return crcRet;
}